

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O1

bool __thiscall BamTools::SplitTool::SplitToolPrivate::SplitPaired(SplitToolPrivate *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  long *plVar6;
  BamWriter *this_00;
  ostream *poVar7;
  _Rb_tree_header *p_Var8;
  size_type *psVar9;
  undefined1 *__rhs;
  bool bVar10;
  string outputFilename;
  map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
  outputFiles;
  BamAlignment al;
  string local_220;
  SplitToolPrivate *local_200;
  RefVector *local_1f8;
  string *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  BamReader *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  _Rb_tree<bool,_std::pair<const_bool,_BamTools::BamWriter_*>,_std::_Select1st<std::pair<const_bool,_BamTools::BamWriter_*>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
  local_1b8;
  BamAlignment local_188;
  
  p_Var1 = &local_1b8._M_impl.super__Rb_tree_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  BamAlignment::BamAlignment(&local_188);
  local_1e0 = &this->m_reader;
  local_1e8 = &this->m_outputFilenameStub;
  local_1f0 = &this->m_header;
  local_1f8 = &this->m_references;
  local_200 = this;
  while (bVar3 = BamReader::GetNextAlignment(local_1e0,&local_188), bVar3) {
    bVar4 = BamAlignment::IsPaired(&local_188);
    p_Var5 = &p_Var1->_M_header;
    for (p_Var2 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar10]) {
      bVar10 = (byte)*(size_t *)(p_Var2 + 1) < bVar4;
      if (!bVar10) {
        p_Var5 = p_Var2;
      }
    }
    p_Var8 = p_Var1;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (p_Var8 = (_Rb_tree_header *)p_Var5, bVar4 < (byte)((_Rb_tree_header *)p_Var5)->_M_node_count
       )) {
      p_Var8 = p_Var1;
    }
    if (p_Var8 == p_Var1) {
      __rhs = SPLIT_SINGLE_TOKEN_abi_cxx11_;
      if (bVar4) {
        __rhs = SPLIT_PAIRED_TOKEN_abi_cxx11_;
      }
      std::operator+(&local_1d8,local_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_220.field_2._M_allocated_capacity = *psVar9;
        local_220.field_2._8_8_ = plVar6[3];
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      }
      else {
        local_220.field_2._M_allocated_capacity = *psVar9;
        local_220._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_220._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_) !=
          &local_1d8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_))
        ;
      }
      this_00 = (BamWriter *)operator_new(8);
      BamWriter::BamWriter(this_00);
      bVar10 = BamWriter::Open(this_00,&local_220,local_1f0,local_1f8);
      if (bVar10) {
        local_1d8._M_dataplus._M_p._0_1_ = bVar4;
        local_1d8._M_string_length = (size_type)this_00;
        std::
        _Rb_tree<bool,std::pair<bool_const,BamTools::BamWriter*>,std::_Select1st<std::pair<bool_const,BamTools::BamWriter*>>,std::less<bool>,std::allocator<std::pair<bool_const,BamTools::BamWriter*>>>
        ::_M_emplace_unique<std::pair<bool,BamTools::BamWriter*>>
                  ((_Rb_tree<bool,std::pair<bool_const,BamTools::BamWriter*>,std::_Select1st<std::pair<bool_const,BamTools::BamWriter*>>,std::less<bool>,std::allocator<std::pair<bool_const,BamTools::BamWriter*>>>
                    *)&local_1b8,(pair<bool,_BamTools::BamWriter_*> *)&local_1d8);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bamtool split ERROR: could not open ",0x24);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_220._M_dataplus._M_p,
                            local_220._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," for writing.",0xd);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      if (!bVar10) goto LAB_0013651b;
    }
    else {
      this_00 = *(BamWriter **)(p_Var8 + 1);
    }
    if (this_00 != (BamWriter *)0x0) {
      BamWriter::SaveAlignment(this_00,&local_188);
    }
  }
  CloseWriters<bool>(local_200,
                     (map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
                      *)&local_1b8);
LAB_0013651b:
  BamAlignment::~BamAlignment(&local_188);
  std::
  _Rb_tree<bool,_std::pair<const_bool,_BamTools::BamWriter_*>,_std::_Select1st<std::pair<const_bool,_BamTools::BamWriter_*>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
  ::~_Rb_tree(&local_1b8);
  return !bVar3;
}

Assistant:

bool SplitTool::SplitToolPrivate::SplitPaired()
{

    // set up splitting data structure
    std::map<bool, BamWriter*> outputFiles;
    std::map<bool, BamWriter*>::iterator writerIter;

    // iterate through alignments
    BamAlignment al;
    BamWriter* writer;
    bool isCurrentAlignmentPaired;
    while (m_reader.GetNextAlignment(al)) {

        // see if bool value exists
        isCurrentAlignmentPaired = al.IsPaired();
        writerIter = outputFiles.find(isCurrentAlignmentPaired);

        // if no writer associated with this value
        if (writerIter == outputFiles.end()) {

            // open new BamWriter
            const std::string outputFilename =
                m_outputFilenameStub +
                (isCurrentAlignmentPaired ? SPLIT_PAIRED_TOKEN : SPLIT_SINGLE_TOKEN) + ".bam";
            writer = new BamWriter;
            if (!writer->Open(outputFilename, m_header, m_references)) {
                std::cerr << "bamtool split ERROR: could not open " << outputFilename
                          << " for writing." << std::endl;
                return false;
            }

            // store in map
            outputFiles.insert(std::make_pair(isCurrentAlignmentPaired, writer));
        }

        // else grab corresponding writer
        else {
            writer = (*writerIter).second;
        }

        // store alignment in proper BAM output file
        if (writer) {
            writer->SaveAlignment(al);
        }
    }

    // clean up BamWriters
    CloseWriters(outputFiles);

    // return success
    return true;
}